

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Base.cpp
# Opt level: O0

uint16_t __thiscall CPU::WDC65816::ProcessorBase::value_of(ProcessorBase *this,Register r)

{
  byte bVar1;
  Register r_local;
  ProcessorBase *this_local;
  
  switch(r) {
  case LastOperationAddress:
    this_local._6_2_ = (this->super_ProcessorStorage).last_operation_pc_;
    break;
  case ProgramCounter:
    this_local._6_2_ = (this->super_ProcessorStorage).registers_.pc;
    break;
  case StackPointer:
    this_local._6_2_ = (this->super_ProcessorStorage).registers_.s.full;
    break;
  case Flags:
    bVar1 = ProcessorStorage::get_flags(&this->super_ProcessorStorage);
    this_local._6_2_ = (ushort)bVar1;
    break;
  case A:
    this_local._6_2_ = (this->super_ProcessorStorage).registers_.a.full;
    break;
  case X:
    this_local._6_2_ = (this->super_ProcessorStorage).registers_.x.full;
    break;
  case Y:
    this_local._6_2_ = (this->super_ProcessorStorage).registers_.y.full;
    break;
  case EmulationFlag:
    this_local._6_2_ = (ushort)((this->super_ProcessorStorage).registers_.emulation_flag & 1);
    break;
  case DataBank:
    this_local._6_2_ = (ushort)((this->super_ProcessorStorage).registers_.data_bank >> 0x10);
    break;
  case ProgramBank:
    this_local._6_2_ = (ushort)((this->super_ProcessorStorage).registers_.program_bank >> 0x10);
    break;
  case Direct:
    this_local._6_2_ = (this->super_ProcessorStorage).registers_.direct;
    break;
  default:
    this_local._6_2_ = 0;
  }
  return this_local._6_2_;
}

Assistant:

uint16_t ProcessorBase::value_of(Register r) const {
	switch (r) {
		case Register::ProgramCounter:			return registers_.pc;
		case Register::LastOperationAddress:	return last_operation_pc_;
		case Register::StackPointer:			return registers_.s.full;
		case Register::Flags:					return get_flags();
		case Register::A:						return registers_.a.full;
		case Register::X:						return registers_.x.full;
		case Register::Y:						return registers_.y.full;
		case Register::EmulationFlag:			return registers_.emulation_flag;
		case Register::DataBank:				return registers_.data_bank >> 16;
		case Register::ProgramBank:				return registers_.program_bank >> 16;
		case Register::Direct:					return registers_.direct;
		default: return 0;
	}
}